

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

uint64 crnlib::pack_etc1_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 ,pack_etc1_block_context *context)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  etc1_optimizer *this;
  ulong *puVar6;
  bool bVar7;
  color_quad_u8 *pcVar8;
  undefined7 extraout_var;
  void *pvVar9;
  undefined7 uVar10;
  undefined2 uVar11;
  uint uVar12;
  ulong *puVar13;
  undefined1 *puVar14;
  byte bVar15;
  undefined2 uVar16;
  uint uVar17;
  undefined2 *puVar18;
  short *psVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  byte *pbVar25;
  uint uVar26;
  int iVar27;
  ulong *puVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  ushort *puVar33;
  ushort *puVar34;
  uint uVar35;
  int subblock;
  int iVar36;
  uint i;
  int iVar37;
  long lVar38;
  bool bVar39;
  color_quad_u8 subblock_pixel0;
  color_quad_u8 subblock_pixels [8];
  results results [3];
  uint8 best_selectors [2] [8];
  uint8 selectors [3] [8];
  color_quad_u8 dithered_pixels [16];
  undefined1 local_2b6;
  undefined1 local_2b5;
  byte local_2b4;
  undefined1 local_2b3;
  byte local_2b2;
  byte local_2b1;
  byte local_2b0;
  byte local_2af;
  byte local_2ae;
  byte local_2ac [4];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  byte *local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  undefined4 local_25c;
  int local_258;
  int local_254;
  uint local_250;
  uint local_24c;
  etc1_block *local_248;
  uint64 local_240;
  color_quad_u8 *local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  uint64 local_208;
  undefined4 auStack_200 [2];
  ulong local_1f8;
  byte local_1f0;
  byte local_1ef;
  char local_1ee;
  undefined1 local_1ed;
  int local_1ec;
  void *local_1e0;
  byte local_1d8;
  undefined8 local_1d0;
  byte local_1c8;
  byte local_1c7;
  byte local_1c6;
  undefined1 local_1c5;
  undefined4 local_1c4;
  void *local_1b8;
  undefined1 local_1b0 [8];
  ulong local_1a8;
  byte abStack_1a0 [4];
  uint uStack_19c;
  ulong local_198;
  void *pvStack_190;
  byte local_188 [8];
  undefined8 local_180;
  byte local_178;
  byte local_177;
  byte local_176;
  undefined1 local_175;
  undefined4 local_174;
  uint local_170;
  void *local_168;
  undefined1 local_160;
  void *local_158;
  byte local_150 [4];
  uint local_14c;
  uint local_148;
  long *local_140;
  byte local_138;
  undefined8 local_128;
  ulong local_120;
  etc1_optimizer *local_118;
  long local_110;
  void *local_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  crn_etc1_pack_params local_e0;
  undefined4 local_d8;
  undefined8 *local_d0;
  undefined1 local_c8;
  int *local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined1 local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  color_quad_u8 local_78 [18];
  
  local_118 = &context->m_optimizer;
  local_248 = dst_block;
  uVar12 = 0xf;
  uVar26 = 0x10;
  do {
    uVar30 = uVar26 - 1;
    uVar23 = uVar30;
    if (((pSrc_pixels[uVar30].field_0.field_0.r != (pSrc_pixels->field_0).field_0.r) ||
        (uVar23 = uVar12, pSrc_pixels[uVar30].field_0.field_0.g != (pSrc_pixels->field_0).field_0.g)
        ) || (pSrc_pixels[uVar30].field_0.field_0.b != (pSrc_pixels->field_0).field_0.b))
    goto LAB_0018d932;
    uVar12 = uVar12 - 1;
    uVar26 = uVar26 - 1;
  } while (1 < uVar26);
  uVar23 = 0;
LAB_0018d932:
  if (uVar23 == 0) {
    uVar23 = 0xffffffff;
    uVar12 = 0;
    uVar26 = 0;
    uVar21 = 0;
    local_270 = 0;
    uVar29 = 0;
    do {
      if (uVar29 == 3) break;
      bVar39 = false;
      iVar32 = -1;
      do {
        iVar27 = iVar32 + (uint)(pSrc_pixels->field_0).c[uVar29];
        if (0xfe < iVar27) {
          iVar27 = 0xff;
        }
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        puVar33 = &g_color8_to_etc_block_config_0_255;
        if (iVar27 != 0) {
          if (iVar27 == 0xff) {
            puVar33 = &DAT_001ac712;
          }
          else {
            puVar33 = &g_color8_to_etc_block_config_1_to_254 + (long)(iVar27 + -1) * 0xc;
          }
        }
        local_218._0_4_ = (uint)(pSrc_pixels->field_0).c[uVar29];
        do {
          puVar34 = puVar33 + 1;
          uVar35 = (uint)*puVar33;
          uVar30 = (uVar35 & 0xff) << 9;
          uVar2 = *(ushort *)
                   (g_etc1_inverse_lookup +
                   (ulong)(pSrc_pixels->field_0).c
                          [(uint)(&rg_etc1::
                                   pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                   ::s_next_comp)[uVar29]] * 2 + (ulong)uVar30);
          uVar3 = *(ushort *)
                   (g_etc1_inverse_lookup +
                   (ulong)(pSrc_pixels->field_0).c[(uint)(&DAT_001adfa4)[uVar29]] * 2 +
                   (ulong)uVar30);
          uVar30 = (uint)(uVar2 >> 8);
          uVar17 = (uint)(uVar3 >> 8);
          uVar30 = uVar17 * uVar17 +
                   uVar30 * uVar30 + (iVar27 - (uint)local_218) * (iVar27 - (uint)local_218);
          iVar36 = 0;
          bVar7 = true;
          if (uVar30 < uVar23) {
            uVar26 = uVar2 & 0xff;
            uVar12 = uVar3 & 0xff;
            if (uVar30 == 0) {
              bVar7 = false;
              iVar36 = 10;
              uVar21 = (ulong)uVar35;
              local_270 = uVar29 & 0xffffffff;
              uVar23 = 0;
            }
            else {
              iVar36 = 0;
              uVar21 = (ulong)uVar35;
              local_270 = uVar29 & 0xffffffff;
              uVar23 = uVar30;
            }
          }
          if (!bVar7) goto LAB_0018e725;
          puVar33 = puVar34;
        } while (*puVar34 != 0xffff);
        iVar36 = 0;
LAB_0018e725:
        if (iVar36 != 0) break;
        iVar27 = iVar32 + 1;
        bVar39 = 0 < iVar32;
        iVar32 = iVar27;
      } while (iVar27 != 2);
      uVar29 = uVar29 + 1;
    } while (bVar39);
    (dst_block->field_0).m_bytes[3] =
         ((byte)uVar21 * '\x02' & 0x1c) * '\t' + ((byte)uVar21 & 1) * '\x02';
    bVar15 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)((uint)(uVar21 >> 4) & 3));
    *(short *)((long)&dst_block->field_0 + 4) = (short)((int)((uint)bVar15 << 0x1e) >> 0x1f);
    *(ushort *)((long)&dst_block->field_0 + 6) = -(bVar15 & 1);
    uVar30 = (uint)uVar21 >> 8;
    if ((uVar21 & 1) == 0) {
      dst_block->m_low_color[local_270 - 8] = (byte)(uVar30 << 4) | (byte)(uVar21 >> 8);
      dst_block->m_low_color
      [(ulong)(uint)(&rg_etc1::
                      pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                      ::s_next_comp)[local_270] - 8] = (byte)(uVar26 << 4) | (byte)uVar26;
      bVar15 = (byte)(uVar12 << 4) | (byte)uVar12;
    }
    else {
      dst_block->m_low_color[local_270 - 8] = (uint8)(uVar30 << 3);
      dst_block->m_low_color
      [(ulong)(uint)(&rg_etc1::
                      pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                      ::s_next_comp)[local_270] - 8] = (byte)uVar26 << 3;
      bVar15 = (byte)uVar12 << 3;
    }
    dst_block->m_low_color
    [(ulong)(uint)(&rg_etc1::
                    pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                    ::s_next_comp)[(int)local_270 + 1] - 8] = bVar15;
    return (ulong)uVar23 << 4;
  }
  if (pack_params->m_dithering == true) {
    puVar13 = &local_1a8;
    pcVar8 = local_78;
    puVar28 = &local_198;
    lVar38 = 0;
    do {
      local_198 = 0;
      pvStack_190 = (void *)0x0;
      local_1a8 = 0;
      _abStack_1a0 = 0;
      lVar31 = 0;
      puVar6 = puVar13;
      do {
        puVar13 = puVar28;
        puVar28 = puVar6;
        bVar15 = (pSrc_pixels->field_0).c[lVar31];
        bVar22 = (&DAT_001e03d8)
                 [(long)((int)*puVar13 * 5 + *(int *)((long)puVar13 + 4) * 3 >> 4) + (ulong)bVar15];
        (pcVar8->field_0).c[lVar31] = bVar22;
        iVar32 = (uint)bVar15 - (uint)bVar22;
        *(int *)puVar28 = iVar32;
        bVar15 = pSrc_pixels[1].field_0.c[lVar31];
        bVar22 = (&DAT_001e03d8)
                 [(long)(*(int *)((long)puVar13 + 4) * 5 + (int)puVar13[1] * 3 + iVar32 * 7 +
                         (int)*puVar13 >> 4) + (ulong)bVar15];
        pcVar8[1].field_0.c[lVar31] = bVar22;
        iVar32 = (uint)bVar15 - (uint)bVar22;
        *(int *)((long)puVar28 + 4) = iVar32;
        bVar15 = pSrc_pixels[2].field_0.c[lVar31];
        bVar22 = (&DAT_001e03d8)
                 [(long)((int)puVar13[1] * 5 + *(int *)((long)puVar13 + 0xc) * 3 + iVar32 * 7 +
                         *(int *)((long)puVar13 + 4) >> 4) + (ulong)bVar15];
        pcVar8[2].field_0.c[lVar31] = bVar22;
        iVar32 = (uint)bVar15 - (uint)bVar22;
        *(int *)(puVar28 + 1) = iVar32;
        bVar15 = pSrc_pixels[3].field_0.c[lVar31];
        bVar22 = (&DAT_001e03d8)
                 [(long)(*(int *)((long)puVar13 + 0xc) * 5 + iVar32 * 7 + (int)puVar13[1] >> 4) +
                  (ulong)bVar15];
        pcVar8[3].field_0.c[lVar31] = bVar22;
        *(uint *)((long)puVar28 + 0xc) = (uint)bVar15 - (uint)bVar22;
        lVar31 = lVar31 + 0x10;
        puVar6 = puVar13;
      } while ((int)lVar31 != 0x40);
      lVar38 = lVar38 + 1;
      pcVar8 = (color_quad_u8 *)((long)&pcVar8->field_0 + 1);
      pSrc_pixels = (color_quad_u8 *)((long)&pSrc_pixels->field_0 + 1);
    } while (lVar38 != 3);
    pSrc_pixels = local_78;
  }
  lVar38 = 3;
  puVar14 = local_a8;
  do {
    auStack_200[lVar38 * 2] = 8;
    (&local_1f8)[lVar38] = (ulong)puVar14;
    lVar38 = lVar38 + 5;
    puVar14 = puVar14 + 8;
  } while (lVar38 == 8);
  local_238 = pSrc_pixels;
  lVar38 = 3;
  puVar14 = local_98;
  do {
    *(undefined4 *)(local_1b0 + lVar38 * 8) = 8;
    (&local_1a8)[lVar38] = (ulong)puVar14;
    lVar38 = lVar38 + 5;
    puVar14 = puVar14 + 8;
  } while (lVar38 != 0x12);
  local_e0 = *pack_params;
  local_c8 = 0;
  local_c0 = &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_b8 = 1;
  uStack_b4 = 0;
  local_b0 = 0;
  local_d8 = 8;
  local_d0 = &local_2a8;
  local_2af = local_1f0;
  local_2ae = local_1ef;
  local_250 = (uint)CONCAT71((int7)((ulong)&local_2a8 >> 8),local_1ee);
  local_2b3 = local_1ed;
  local_2b4 = local_1d8;
  local_258 = local_1ec;
  local_2b2 = local_1c8;
  local_2b1 = local_1c7;
  local_2b0 = local_1c6;
  local_2b5 = local_1c5;
  local_2b6 = local_1b0[0];
  local_25c = local_1c4;
  local_128 = local_1d0;
  local_120 = local_1f8;
  local_100 = local_1e0;
  local_240 = 0xffffffffffffffff;
  local_108 = local_1b8;
  local_254 = 0;
  local_210 = 0;
  local_230 = 0;
  do {
    uVar12 = 0;
    do {
      bVar39 = true;
      lVar38 = 0;
      local_208 = 0;
      do {
        if ((int)local_230 == 0) {
          local_2a8 = CONCAT17(local_238[lVar38 * 2 + 4].field_0.field_0.a,
                               CONCAT16(local_238[lVar38 * 2 + 4].field_0.field_0.b,
                                        CONCAT15(local_238[lVar38 * 2 + 4].field_0.field_0.g,
                                                 CONCAT14(local_238[lVar38 * 2 + 4].field_0.field_0.
                                                          r,CONCAT13(local_238[lVar38 * 2].field_0.
                                                                     field_0.a,
                                                                     CONCAT12(local_238[lVar38 * 2].
                                                                              field_0.field_0.b,
                                                                              CONCAT11(local_238[
                                                  lVar38 * 2].field_0.field_0.g,
                                                  local_238[lVar38 * 2].field_0.field_0.r)))))));
          uStack_2a0 = CONCAT17(local_238[lVar38 * 2 + 0xc].field_0.field_0.a,
                                CONCAT16(local_238[lVar38 * 2 + 0xc].field_0.field_0.b,
                                         CONCAT15(local_238[lVar38 * 2 + 0xc].field_0.field_0.g,
                                                  CONCAT14(local_238[lVar38 * 2 + 0xc].field_0.
                                                           field_0.r,
                                                           CONCAT13(local_238[lVar38 * 2 + 8].
                                                                    field_0.field_0.a,
                                                                    CONCAT12(local_238[lVar38 * 2 +
                                                                                       8].field_0.
                                                                             field_0.b,
                                                                             CONCAT11(local_238[
                                                  lVar38 * 2 + 8].field_0.field_0.g,
                                                  local_238[lVar38 * 2 + 8].field_0.field_0.r)))))))
          ;
          local_298 = CONCAT17(local_238[lVar38 * 2 + 5].field_0.field_0.a,
                               CONCAT16(local_238[lVar38 * 2 + 5].field_0.field_0.b,
                                        CONCAT15(local_238[lVar38 * 2 + 5].field_0.field_0.g,
                                                 CONCAT14(local_238[lVar38 * 2 + 5].field_0.field_0.
                                                          r,CONCAT13(local_238[lVar38 * 2 + 1].
                                                                     field_0.field_0.a,
                                                                     CONCAT12(local_238[lVar38 * 2 +
                                                                                        1].field_0.
                                                                              field_0.b,
                                                                              CONCAT11(local_238[
                                                  lVar38 * 2 + 1].field_0.field_0.g,
                                                  local_238[lVar38 * 2 + 1].field_0.field_0.r)))))))
          ;
          uStack_290 = CONCAT17(local_238[lVar38 * 2 + 0xd].field_0.field_0.a,
                                CONCAT16(local_238[lVar38 * 2 + 0xd].field_0.field_0.b,
                                         CONCAT15(local_238[lVar38 * 2 + 0xd].field_0.field_0.g,
                                                  CONCAT14(local_238[lVar38 * 2 + 0xd].field_0.
                                                           field_0.r,
                                                           CONCAT13(local_238[lVar38 * 2 + 9].
                                                                    field_0.field_0.a,
                                                                    CONCAT12(local_238[lVar38 * 2 +
                                                                                       9].field_0.
                                                                             field_0.b,
                                                                             CONCAT11(local_238[
                                                  lVar38 * 2 + 9].field_0.field_0.g,
                                                  local_238[lVar38 * 2 + 9].field_0.field_0.r)))))))
          ;
        }
        else {
          local_298 = *(undefined8 *)(local_238 + lVar38 * 8 + 4);
          uStack_290 = *(undefined8 *)(local_238 + lVar38 * 8 + 4 + 2);
          local_2a8 = *(undefined8 *)(local_238 + lVar38 * 8);
          uStack_2a0 = *(undefined8 *)(local_238 + lVar38 * 8 + 2);
        }
        local_158 = (void *)0xffffffffffffffff;
        local_110 = lVar38;
        if ((uVar12 != 0 || (int)lVar38 != 0) && local_e0.m_quality != cCRNETCQualityFast) {
          local_2ac[0] = (byte)local_2a8;
          local_2ac[1] = local_2a8._1_1_;
          local_2ac[2] = local_2a8._2_1_;
          local_2ac[3] = local_2a8._3_1_;
          uVar26 = 7;
          uVar23 = 8;
          do {
            uVar29 = (ulong)(uVar23 - 1);
            uVar30 = uVar23 - 1;
            if (((*(byte *)((long)&local_2a8 + uVar29 * 4) != (byte)local_2a8) ||
                (uVar30 = uVar26, *(char *)((long)&local_2a8 + uVar29 * 4 + 1) != local_2a8._1_1_))
               || (*(char *)((long)&local_2a8 + uVar29 * 4 + 2) != local_2a8._2_1_))
            goto LAB_0018de29;
            uVar26 = uVar26 - 1;
            uVar23 = uVar23 - 1;
          } while (1 < uVar23);
          uVar30 = 0;
LAB_0018de29:
          if (uVar30 == 0) {
            local_280 = (byte *)0x0;
            if (lVar38 != 0 && uVar12 == 0) {
              local_280 = abStack_1a0;
            }
            uVar26 = 0xffffffff;
            local_220 = local_220 & 0xffffffff00000000;
            local_228 = local_228 & 0xffffffff00000000;
            local_24c = 0;
            local_268 = 0;
            uVar29 = 0;
            do {
              if (uVar29 == 3) break;
              local_278 = (ulong)(uint)(&rg_etc1::
                                         pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                         ::s_next_comp)[uVar29];
              local_218 = (ulong)(uint)(&DAT_001adfa4)[uVar29];
              local_f8 = uVar29 + 1;
              uVar24 = 0xffffffff;
              uVar20 = 0;
              local_f0 = (ulong)local_2ac[uVar29];
              uVar21 = (ulong)local_2ac[uVar29];
              do {
                auStack_200[1] = (int)uVar20;
                iVar32 = (int)uVar24;
                iVar27 = iVar32 + (int)uVar21;
                if (0xfe < iVar27) {
                  iVar27 = 0xff;
                }
                if (iVar27 < 1) {
                  iVar27 = 0;
                }
                puVar18 = &g_color8_to_etc_block_config_0_255;
                if (iVar27 != 0) {
                  if (iVar27 == 0xff) {
                    puVar18 = &DAT_001ac712;
                  }
                  else {
                    puVar18 = &g_color8_to_etc_block_config_1_to_254 + (long)(iVar27 + -1) * 0xc;
                  }
                }
                local_e8 = uVar24;
                iVar27 = iVar27 - (int)uVar21;
                uVar23 = iVar27 * iVar27;
                psVar19 = puVar18 + 1;
                local_270 = (ulong)uVar23;
                do {
                  uVar2 = psVar19[-1];
                  bVar15 = (byte)uVar2;
                  if ((uVar12 == 0) == (bool)(bVar15 & 1)) {
                    bVar22 = (lVar38 != 0 && uVar12 == 0) & bVar15;
                    if ((bVar22 == 1) && (7 < ((uint)(uVar2 >> 8) - (uint)local_280[uVar29]) + 4)) {
                      bVar15 = *psVar19 == -1 ^ 9;
                    }
                    else {
                      uVar3 = *(ushort *)
                               (g_etc1_inverse_lookup +
                               (ulong)local_2ac[local_278] * 2 + (ulong)bVar15 * 0x200);
                      uVar4 = *(ushort *)
                               (g_etc1_inverse_lookup +
                               (ulong)local_2ac[local_218] * 2 + (ulong)bVar15 * 0x200);
                      if ((bVar22 == 0) ||
                         (((uVar4 & 0xff) - (uint)local_280[local_218]) + 4 < 8 &&
                          ((uVar3 & 0xff) - (uint)local_280[local_278]) + 4 < 8)) {
                        uVar30 = (uint)(uVar4 >> 8) * (uint)(uVar4 >> 8) +
                                 (uint)(uVar3 >> 8) * (uint)(uVar3 >> 8) + uVar23;
                        bVar15 = 0;
                        if (uVar30 < uVar26) {
                          bVar15 = 0;
                          if (uVar30 == 0) {
                            bVar15 = 10;
                          }
                          local_220 = CONCAT44(local_220._4_4_,(uint)uVar4);
                          local_228 = CONCAT44(local_228._4_4_,(uint)uVar3);
                          local_24c = (uint)uVar2;
                          local_268 = uVar29 & 0xffffffff;
                          uVar26 = uVar30;
                        }
                      }
                      else {
                        bVar15 = *psVar19 == -1 ^ 9;
                      }
                    }
                  }
                  else {
                    bVar15 = *psVar19 == -1 ^ 9;
                  }
                  if ((bVar15 != 0) && (bVar15 != 9)) {
                    if (bVar15 != 8) {
                      uVar20 = uVar20 & 0xffffffff;
                      goto LAB_0018e104;
                    }
                    break;
                  }
                  sVar5 = *psVar19;
                  psVar19 = psVar19 + 1;
                } while (sVar5 != -1);
                uVar20 = CONCAT71((int7)((ulong)psVar19 >> 8),0 < iVar32);
                uVar24 = (ulong)(iVar32 + 1U);
                uVar21 = local_f0;
              } while (iVar32 + 1U != 2);
LAB_0018e104:
              uVar29 = local_f8;
            } while ((uVar20 & 1) != 0);
            if (uVar26 != 0xffffffff) {
              local_158 = (void *)(ulong)(uVar26 << 3);
              local_148 = 8;
              local_138 = ~(byte)local_24c & 1;
              local_14c = local_24c >> 1 & 7;
              *local_140 = ((ulong)(byte)((byte)local_24c >> 4) & 3) * 0x101010101010101;
              local_150[local_268] = (byte)(local_24c >> 8);
              local_150[(uint)(&rg_etc1::
                                pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                ::s_next_comp)[local_268]] = (byte)local_228;
              local_150[(uint)(&rg_etc1::
                                pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                ::s_next_comp)[(int)local_268 + 1]] = (byte)local_220;
            }
          }
        }
        this = local_118;
        local_c8 = (undefined1)uVar12;
        local_b0 = lVar38 != 0 && uVar12 == 0;
        if ((bool)local_b0) {
          uStack_b4 = (undefined4)_abStack_1a0;
        }
        if (local_e0.m_quality == cCRNETCQualitySlow) {
          local_b8 = 9;
          local_c0 = pack_etc1_block::s_scan_delta_0_to_4;
        }
        else if (local_e0.m_quality == cCRNETCQualityMedium) {
          local_b8 = 3;
          local_c0 = pack_etc1_block::s_scan_delta_0_to_1;
        }
        else {
          local_b8 = 1;
          local_c0 = pack_etc1_block::s_scan_delta_0;
        }
        lVar31 = lVar38 * 0x28;
        puVar13 = &local_1a8 + lVar38 * 5;
        etc1_optimizer::init(local_118,(EVP_PKEY_CTX *)&local_e0);
        bVar7 = etc1_optimizer::compute(this);
        uVar10 = extraout_var;
        if (!bVar7) break;
        if ((local_e0.m_quality == cCRNETCQualityFast) || (uVar29 = *puVar13, uVar29 < 0xbb9)) {
LAB_0018e2ea:
          pvVar9 = local_158;
          if (local_158 < (void *)*puVar13) {
            abStack_1a0[lVar31] = local_150[0];
            abStack_1a0[lVar31 + 1] = local_150[1];
            abStack_1a0[lVar31 + 2] = local_150[2];
            abStack_1a0[lVar31 + 3] = local_150[3];
            local_188[lVar31] = local_138;
            *(uint *)(abStack_1a0 + lVar31 + 4) = local_14c;
            *puVar13 = (ulong)pvVar9;
            pvVar9 = memcpy(*(void **)(local_188 + lVar31 + -8),local_140,(ulong)local_148);
          }
          local_208 = local_208 + *puVar13;
          bVar7 = local_208 < local_240;
          uVar10 = (undefined7)((ulong)pvVar9 >> 8);
        }
        else {
          local_b8 = 2;
          if (6000 < uVar29) {
            local_b8 = 8;
          }
          local_c0 = pack_etc1_block::s_scan_delta_5_to_5;
          if (6000 < uVar29) {
            local_c0 = pack_etc1_block::s_scan_delta_5_to_8;
          }
          if (local_e0.m_quality == cCRNETCQualityMedium) {
            local_b8 = 4;
            local_c0 = pack_etc1_block::s_scan_delta_2_to_3;
          }
          bVar7 = etc1_optimizer::compute(local_118);
          if (bVar7) goto LAB_0018e2ea;
          bVar7 = false;
          uVar10 = 0;
        }
        if (!bVar7) break;
        lVar38 = local_110 + 1;
        bVar39 = local_110 == 0;
      } while (bVar39);
      if (!bVar39) {
        local_2af = abStack_1a0[0];
        local_2ae = abStack_1a0[1];
        local_250 = (uint)CONCAT71(uVar10,abStack_1a0[2]);
        local_2b3 = abStack_1a0[3];
        local_2b4 = local_188[0];
        local_258 = uStack_19c;
        local_120 = local_1a8;
        memcpy(local_100,pvStack_190,local_198 & 0xffffffff);
        local_2b2 = local_178;
        local_2b1 = local_177;
        local_2b0 = local_176;
        local_2b5 = local_175;
        local_2b6 = local_160;
        local_25c = local_174;
        local_128 = local_180;
        memcpy(local_108,local_168,(ulong)local_170);
        local_210 = (ulong)uVar12;
        local_254 = (int)local_230;
        local_240 = local_208;
      }
      bVar39 = uVar12 == 0;
      uVar12 = uVar12 + 1;
    } while (bVar39);
    iVar32 = (int)local_230;
    local_230 = (ulong)(iVar32 + 1);
  } while (iVar32 == 0);
  local_1f0 = local_2af;
  local_1ef = local_2ae;
  local_1ee = (char)local_250;
  local_1ed = local_2b3;
  local_1d8 = local_2b4;
  local_1ec = local_258;
  local_1c8 = local_2b2;
  local_1c7 = local_2b1;
  local_1c6 = local_2b0;
  local_1c5 = local_2b5;
  local_1b0[0] = local_2b6;
  local_1c4 = local_25c;
  local_1d0 = local_128;
  local_1f8 = local_120;
  iVar32 = (int)local_210;
  if (iVar32 != 0) {
    (local_248->field_0).m_bytes[0] = local_2af << 4 | local_2b2;
    (local_248->field_0).m_bytes[1] = local_2ae << 4 | local_2b1;
    local_2b0 = (char)local_250 << 4 | local_2b0;
    goto LAB_0018e88d;
  }
  iVar27 = (uint)local_2b2 - (uint)local_2af;
  iVar37 = (uint)local_2b1 - (uint)local_2ae;
  uVar12 = local_250 & 0xff;
  iVar36 = local_2b0 - uVar12;
  iVar32 = iVar37;
  if (iVar27 < iVar37) {
    iVar32 = iVar27;
  }
  if (iVar36 <= iVar32) {
    iVar32 = iVar36;
  }
  if (iVar32 < -4) {
LAB_0018e833:
    crnlib_assert("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_etc.cpp"
                  ,0x6f0);
  }
  else {
    iVar32 = iVar37;
    if (iVar37 < iVar27) {
      iVar32 = iVar27;
    }
    if (iVar32 <= iVar36) {
      iVar32 = iVar36;
    }
    if (3 < iVar32) goto LAB_0018e833;
  }
  (local_248->field_0).m_bytes[0] = local_2af << 3 | (char)iVar27 + (char)(iVar27 >> 0x1f) * -8;
  (local_248->field_0).m_bytes[1] = local_2ae << 3 | (char)iVar37 + (char)(iVar37 >> 0x1f) * -8;
  local_2b0 = (byte)(uVar12 << 3) | (char)iVar36 + (char)(iVar36 >> 0x1f) * -8;
  iVar32 = (int)local_210;
LAB_0018e88d:
  (local_248->field_0).m_bytes[2] = local_2b0;
  (local_248->field_0).m_bytes[3] =
       (((char)iVar32 * '\x02' & 2U) + (char)local_1c4 * '\x04' | (byte)(local_1ec << 5)) ^ 2 |
       (byte)local_254;
  if (local_254 == 0) {
    uVar26 = 0;
    lVar38 = 1;
    uVar12 = 0;
    do {
      pbVar25 = (byte *)((long)(&local_1e0)[lVar38 * 5] + 7);
      iVar32 = 1;
      do {
        uVar23 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)*pbVar25) * 2;
        uVar12 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-3]) & 1 |
                 (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-1]) & 1 |
                 (uVar23 & 2) + uVar12 * 4) * 4 +
                 (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-2]) & 1) * 2;
        uVar11 = (undefined2)uVar12;
        uVar26 = (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-3]) >> 1) |
                 *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-2]) & 0xfffffffe |
                 (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-1]) & 0xfffffffe |
                  uVar26 << 3 | uVar23 & 0xfffffffc) * 2;
        uVar16 = (undefined2)uVar26;
        pbVar25 = pbVar25 + -4;
        iVar32 = iVar32 + -1;
      } while (iVar32 == 0);
      bVar39 = lVar38 != 0;
      lVar38 = lVar38 + -1;
    } while (bVar39);
  }
  else {
    uVar26 = 0;
    lVar38 = 7;
    uVar12 = 0;
    do {
      bVar15 = *(byte *)((long)&g_selector_index_to_etc1 +
                        (ulong)*(byte *)((long)local_1b8 + lVar38 + -4));
      uVar23 = (uint)*(byte *)((long)&g_selector_index_to_etc1 +
                              (ulong)*(byte *)((long)local_1b8 + lVar38)) * 2;
      bVar22 = *(byte *)((long)&g_selector_index_to_etc1 +
                        (ulong)*(byte *)((long)local_1e0 + lVar38));
      bVar1 = *(byte *)((long)&g_selector_index_to_etc1 +
                       (ulong)*(byte *)((long)local_1e0 + lVar38 + -4));
      uVar12 = bVar1 & 1 | (bVar15 & 1 | (uVar23 & 2) + uVar12 * 4) * 4 + (bVar22 & 1) * 2;
      uVar11 = (undefined2)uVar12;
      uVar26 = (uint)(bVar1 >> 1) | bVar22 & 0xfffffffe |
               (bVar15 & 0xfffffffe | uVar26 << 3 | uVar23 & 0xfffffffc) * 2;
      uVar16 = (undefined2)uVar26;
      lVar38 = lVar38 + -1;
    } while (lVar38 != 3);
  }
  (local_248->field_0).m_bytes[4] = (uint8)((ushort)uVar16 >> 8);
  (local_248->field_0).m_bytes[5] = (uint8)uVar16;
  (local_248->field_0).m_bytes[6] = (uint8)((ushort)uVar11 >> 8);
  (local_248->field_0).m_bytes[7] = (uint8)uVar11;
  return local_240;
}

Assistant:

uint64 pack_etc1_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params, pack_etc1_block_context& context)
    {
        color_quad_u8 src_pixel0(pSrc_pixels[0]);

        int r;
        for (r = 15; r >= 1; --r)
        {
            if ((pSrc_pixels[r].r != src_pixel0.r) || (pSrc_pixels[r].g != src_pixel0.g) || (pSrc_pixels[r].b != src_pixel0.b))
            {
                break;
            }
        }
        if (!r)
        {
            return 16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r, pack_params, context);
        }

        color_quad_u8 dithered_pixels[16];
        if (pack_params.m_dithering)
        {
            DitherBlock(dithered_pixels, pSrc_pixels);
            pSrc_pixels = dithered_pixels;
        }

        uint64 best_error = cUINT64_MAX;
        uint best_flip = false, best_use_color4 = false;

        uint8 best_selectors[2][8];
        etc1_optimizer::results best_results[2];
        for (uint i = 0; i < 2; i++)
        {
            best_results[i].m_n = 8;
            best_results[i].m_pSelectors = best_selectors[i];
        }

        uint8 selectors[3][8];
        etc1_optimizer::results results[3];

        for (uint i = 0; i < 3; i++)
        {
            results[i].m_n = 8;
            results[i].m_pSelectors = selectors[i];
        }

        color_quad_u8 subblock_pixels[8];

        etc1_optimizer::params params(pack_params);
        params.m_num_src_pixels = 8;
        params.m_pSrc_pixels = subblock_pixels;

        for (uint flip = 0; flip < 2; flip++)
        {
            for (uint use_color4 = 0; use_color4 < 2; use_color4++)
            {
                uint64 trial_error = 0;

                uint subblock;
                for (subblock = 0; subblock < 2; subblock++)
                {
                    if (flip)
                    {
                        memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
                    }
                    else
                    {
                        const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
                        subblock_pixels[0] = pSrc_col[0];
                        subblock_pixels[1] = pSrc_col[4];
                        subblock_pixels[2] = pSrc_col[8];
                        subblock_pixels[3] = pSrc_col[12];
                        subblock_pixels[4] = pSrc_col[1];
                        subblock_pixels[5] = pSrc_col[5];
                        subblock_pixels[6] = pSrc_col[9];
                        subblock_pixels[7] = pSrc_col[13];
                    }

                    results[2].m_error = cUINT64_MAX;
                    if ((params.m_quality >= cCRNETCQualityMedium) && ((subblock) || (use_color4)))
                    {
                        color_quad_u8 subblock_pixel0(subblock_pixels[0]);
                        for (r = 7; r >= 1; --r)
                        {
                            if ((subblock_pixels[r].r != subblock_pixel0.r) || (subblock_pixels[r].g != subblock_pixel0.g) || (subblock_pixels[r].b != subblock_pixel0.b))
                            {
                                break;
                            }
                        }
                        if (!r)
                        {
                            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixel0.r, pack_params, context, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : nullptr);
                        }
                    }

                    params.m_use_color4 = (use_color4 != 0);
                    params.m_constrain_against_base_color5 = false;

                    if ((!use_color4) && (subblock))
                    {
                        params.m_constrain_against_base_color5 = true;
                        params.m_base_color5 = results[0].m_block_color_unscaled;
                    }

                    if (params.m_quality == cCRNETCQualitySlow)
                    {
                        static const int s_scan_delta_0_to_4[] = { -4, -3, -2, -1, 0, 1, 2, 3, 4 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_4);
                        params.m_pScan_deltas = s_scan_delta_0_to_4;
                    }
                    else if (params.m_quality == cCRNETCQualityMedium)
                    {
                        static const int s_scan_delta_0_to_1[] = { -1, 0, 1 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_1);
                        params.m_pScan_deltas = s_scan_delta_0_to_1;
                    }
                    else
                    {
                        static const int s_scan_delta_0[] = { 0 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0);
                        params.m_pScan_deltas = s_scan_delta_0;
                    }

                    context.m_optimizer.init(params, results[subblock]);

                    if (!context.m_optimizer.compute())
                    {
                        break;
                    }

                    // Fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
                    const uint refinement_error_thresh0 = 3000;
                    const uint refinement_error_thresh1 = 6000;
                    if ((params.m_quality >= cCRNETCQualityMedium) && (results[subblock].m_error > refinement_error_thresh0))
                    {
                        if (params.m_quality == cCRNETCQualityMedium)
                        {
                            static const int s_scan_delta_2_to_3[] = { -3, -2, 2, 3 };
                            params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_2_to_3);
                            params.m_pScan_deltas = s_scan_delta_2_to_3;
                        }
                        else
                        {
                            static const int s_scan_delta_5_to_5[] = { -5, 5 };
                            static const int s_scan_delta_5_to_8[] = { -8, -7, -6, -5, 5, 6, 7, 8 };
                            if (results[subblock].m_error > refinement_error_thresh1)
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_8);
                                params.m_pScan_deltas = s_scan_delta_5_to_8;
                            }
                            else
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_5);
                                params.m_pScan_deltas = s_scan_delta_5_to_5;
                            }
                        }

                        if (!context.m_optimizer.compute())
                        {
                            break;
                        }
                    }

                    if (results[2].m_error < results[subblock].m_error)
                    {
                        results[subblock] = results[2];
                    }

                    trial_error += results[subblock].m_error;
                    if (trial_error >= best_error)
                    {
                        break;
                    }
                }

                if (subblock < 2)
                {
                    continue;
                }

                best_error = trial_error;
                best_results[0] = results[0];
                best_results[1] = results[1];
                best_flip = flip;
                best_use_color4 = use_color4;

            } // use_color4

        } // flip

        int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
        int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
        int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
        if (!best_use_color4)
        {
            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                // Shouldn't ever happen
                CRNLIB_VERIFY(0);
            }
        }

        if (best_use_color4)
        {
            dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
            dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
            dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
        }
        else
        {
            if (dr < 0)
            {
                dr += 8;
            }
            if (dg < 0)
            {
                dg += 8;
            }
            if (db < 0)
            {
                db += 8;
            }
            dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
            dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
            dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
        }

        dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

        uint selector0 = 0, selector1 = 0;
        if (best_flip)
        {
            // flipped:
            // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
            // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
            //
            // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
            // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
            const uint8* pSelectors0 = best_results[0].m_pSelectors;
            const uint8* pSelectors1 = best_results[1].m_pSelectors;
            for (int x = 3; x >= 0; --x)
            {
                uint b;
                b = g_selector_index_to_etc1[pSelectors1[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors1[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);
            }
        }
        else
        {
            // non-flipped:
            // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
            // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
            //
            // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
            // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
            for (int subblock = 1; subblock >= 0; --subblock)
            {
                const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
                for (uint i = 0; i < 2; i++)
                {
                    uint b;
                    b = g_selector_index_to_etc1[pSelectors[3]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[2]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[1]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[0]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    pSelectors -= 4;
                }
            }
        }

        dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
        dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
        dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
        dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

        return best_error;
    }